

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__apply
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  char **ppcVar2;
  _Base_ptr in_RSI;
  ParserTemplateBase *in_RDI;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  apply__AttributeData *attributeData;
  URI *in_stack_fffffffffffffd98;
  URI *other;
  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
  *in_stack_fffffffffffffda0;
  void **in_stack_fffffffffffffda8;
  StackMemoryManager *in_stack_fffffffffffffdb8;
  bool *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined8 in_stack_fffffffffffffdd0;
  StackMemoryManager *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  XSList<GeneratedSaxParser::ParserString> local_160 [2];
  byte local_52;
  byte local_51;
  _Base_ptr local_50;
  StringHash local_48;
  ElementFunctionMap *local_40;
  ColladaParserAutoGen15 *local_38;
  apply__AttributeData *local_30;
  _Base_ptr local_18;
  
  local_18 = in_RSI;
  local_30 = GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::apply__AttributeData>
                       (in_RDI,in_stack_fffffffffffffda8);
  local_38 = *(ColladaParserAutoGen15 **)local_18;
  if (local_38 != (ColladaParserAutoGen15 *)0x0) {
    while (local_40 = (ElementFunctionMap *)local_38->_vptr_ColladaParserAutoGen15,
          local_40 != (ElementFunctionMap *)0x0) {
      local_48 = GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)local_40);
      if (local_38 + 1 == (ColladaParserAutoGen15 *)0x0) {
        return false;
      }
      local_50 = (_Base_ptr)local_38[1]._vptr_ColladaParserAutoGen15;
      local_38 = local_38 + 2;
      if (local_48 == 0x6f4) {
        local_30->id = (ParserChar *)local_50;
      }
      else if (local_48 == 0x6f8b6) {
        in_stack_fffffffffffffda0 =
             (ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
              *)&stack0xfffffffffffffec0;
        GeneratedSaxParser::Utils::toURI
                  ((ParserChar **)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   in_stack_fffffffffffffdc0);
        COLLADABU::URI::operator=((URI *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        COLLADABU::URI::~URI((URI *)in_stack_fffffffffffffda0);
        if (((local_52 & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)in_stack_fffffffffffffdd0,
                               in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
                               (StringHash)in_stack_fffffffffffffdc0,
                               (StringHash)in_stack_fffffffffffffdb8,(ParserChar *)in_RDI), bVar1))
        {
          return false;
        }
        if ((local_52 & 1) == 0) {
          local_30->present_attributes = local_30->present_attributes | 2;
        }
      }
      else if (local_48 == 0x7f8b6) {
        local_30->xref = (ParserChar *)local_50;
      }
      else if (local_48 == 0x6a28a3) {
        bVar1 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::characterData2StringList
                          (in_stack_fffffffffffffda0,(ParserChar *)in_stack_fffffffffffffd98,
                           (XSList<GeneratedSaxParser::ParserString> *)0xa4707c);
        local_51 = (bVar1 ^ 0xffU) & 1;
        if ((local_51 != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)in_stack_fffffffffffffdd0,
                               in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
                               (StringHash)in_stack_fffffffffffffdc0,
                               (StringHash)in_stack_fffffffffffffdb8,(ParserChar *)in_RDI), bVar1))
        {
          return false;
        }
        if ((local_51 & 1) == 0) {
          local_30->present_attributes = local_30->present_attributes | 1;
        }
      }
      else if (local_48 == 0x7ac025) {
        local_30->style = (ParserChar *)local_50;
      }
      else {
        if ((local_30->unknownAttributes).data == (char **)0x0) {
          ppcVar2 = (char **)GeneratedSaxParser::StackMemoryManager::newObject
                                       (in_stack_fffffffffffffdb8,(size_t)in_RDI);
          (local_30->unknownAttributes).data = ppcVar2;
        }
        else {
          ppcVar2 = (char **)GeneratedSaxParser::StackMemoryManager::growObject
                                       (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
          (local_30->unknownAttributes).data = ppcVar2;
        }
        (local_30->unknownAttributes).data[(local_30->unknownAttributes).size] = (char *)local_40;
        (local_30->unknownAttributes).data[(local_30->unknownAttributes).size + 1] =
             (char *)local_50;
        (local_30->unknownAttributes).size = (local_30->unknownAttributes).size + 2;
      }
    }
    local_40 = (ElementFunctionMap *)0x0;
  }
  if ((local_30->present_attributes & 1) == 0) {
    GeneratedSaxParser::XSList<GeneratedSaxParser::ParserString>::XSList(local_160);
    (local_30->_class).data = local_160[0].data;
    (local_30->_class).size = local_160[0].size;
  }
  if ((local_30->present_attributes & 2) == 0) {
    other = (URI *)&stack0xfffffffffffffdb8;
    COLLADABU::URI::URI((URI *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
    COLLADABU::URI::operator=((URI *)in_stack_fffffffffffffda0,other);
    COLLADABU::URI::~URI((URI *)in_stack_fffffffffffffda0);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__apply( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__apply( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

apply__AttributeData* attributeData = newData<apply__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_APPLY, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_APPLY,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_APPLY,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= apply__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_APPLY,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= apply__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & apply__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & apply__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}